

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkEnum
          (DescriptorBuilder *this,EnumDescriptor *enum_type,EnumDescriptorProto *proto)

{
  long lVar1;
  EnumOptions *pEVar2;
  EnumValueDescriptorProto *extraout_RDX;
  DescriptorBuilder *this_00;
  long lVar3;
  int i;
  long lVar4;
  
  if (*(long *)(enum_type + 0x20) == 0) {
    pEVar2 = EnumOptions::default_instance();
    *(EnumOptions **)(enum_type + 0x20) = pEVar2;
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(enum_type + 0x2c); lVar4 = lVar4 + 1) {
    lVar1 = *(long *)(enum_type + 0x30);
    this_00 = (DescriptorBuilder *)&proto->value_;
    internal::RepeatedPtrFieldBase::
    Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
              (&(proto->value_).super_RepeatedPtrFieldBase,(int)lVar4);
    CrossLinkEnumValue(this_00,(EnumValueDescriptor *)(lVar1 + lVar3),extraout_RDX);
    lVar3 = lVar3 + 0x28;
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkEnum(
    EnumDescriptor* enum_type, const EnumDescriptorProto& proto) {
  if (enum_type->options_ == NULL) {
    enum_type->options_ = &EnumOptions::default_instance();
  }

  for (int i = 0; i < enum_type->value_count(); i++) {
    CrossLinkEnumValue(&enum_type->values_[i], proto.value(i));
  }
}